

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O1

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::
     handleEvent<QWindowSystemInterfacePrivate::WindowStateChangedEvent,QWindow*,QFlags<Qt::WindowState>,QFlags<Qt::WindowState>>
               (QWindow *args,QFlags<Qt::WindowState> args_1,QFlags<Qt::WindowState> args_2)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  undefined1 uVar4;
  long in_FS_OFFSET;
  WindowStateChangedEvent event;
  WindowSystemEvent local_58;
  int *piStack_40;
  QWindow *local_38;
  QFlagsStorageHelper<Qt::WindowState,_4> QStack_30;
  QFlagsStorageHelper<Qt::WindowState,_4> QStack_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = QThread::isMainThread();
  if (cVar1 == '\0') {
    QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::
    handleEvent<QWindowSystemInterfacePrivate::WindowStateChangedEvent,QWindow*,QFlags<Qt::WindowState>,QFlags<Qt::WindowState>>
              (args,args_1,args_2);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      bVar2 = QWindowSystemInterface::flushWindowSystemEvents((ProcessEventsFlags)0x0);
      return bVar2;
    }
    goto LAB_00330f91;
  }
  local_58._20_4_ = 0xaaaaaaaa;
  piStack_40 = (int *)&DAT_aaaaaaaaaaaaaaaa;
  local_38 = (QWindow *)&DAT_aaaaaaaaaaaaaaaa;
  QStack_30.super_QFlagsStorage<Qt::WindowState>.i = (QFlagsStorage<Qt::WindowState>)0xaaaaaaaa;
  QStack_2c.super_QFlagsStorage<Qt::WindowState>.i = (QFlagsStorage<Qt::WindowState>)0xaaaaaaaa;
  local_58.type = WindowStateChanged;
  local_58.flags = 0;
  local_58.eventAccepted = true;
  local_58._17_3_ = 0xaaaaaa;
  local_58._vptr_WindowSystemEvent = (_func_int **)&PTR__WindowStateChangedEvent_007e9e30;
  if (args == (QWindow *)0x0) {
    piStack_40 = (int *)0x0;
  }
  else {
    piStack_40 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(&args->super_QObject);
  }
  local_38 = args;
  QStack_30.super_QFlagsStorage<Qt::WindowState>.i =
       (QFlagsStorage<Qt::WindowState>)
       (QFlagsStorage<Qt::WindowState>)
       args_1.super_QFlagsStorageHelper<Qt::WindowState,_4>.super_QFlagsStorage<Qt::WindowState>.i;
  QStack_2c.super_QFlagsStorage<Qt::WindowState>.i =
       (QFlagsStorage<Qt::WindowState>)
       (QFlagsStorage<Qt::WindowState>)
       args_2.super_QFlagsStorageHelper<Qt::WindowState,_4>.super_QFlagsStorage<Qt::WindowState>.i;
  if (QWindowSystemInterfacePrivate::eventHandler == (QWindowSystemEventHandler *)0x0) {
    QGuiApplicationPrivate::processWindowSystemEvent(&local_58);
LAB_00330f4e:
    uVar4 = local_58.eventAccepted;
  }
  else {
    iVar3 = (*QWindowSystemInterfacePrivate::eventHandler->_vptr_QWindowSystemEventHandler[2])
                      (QWindowSystemInterfacePrivate::eventHandler,&local_58);
    if ((char)iVar3 != '\0') goto LAB_00330f4e;
    uVar4 = 0;
  }
  local_58._vptr_WindowSystemEvent = (_func_int **)&PTR__WindowStateChangedEvent_007e9e30;
  if (piStack_40 != (int *)0x0) {
    LOCK();
    *piStack_40 = *piStack_40 + -1;
    UNLOCK();
    if ((*piStack_40 == 0) && (piStack_40 != (int *)0x0)) {
      operator_delete(piStack_40);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (bool)uVar4;
  }
LAB_00330f91:
  __stack_chk_fail();
}

Assistant:

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::handleEvent(Args ...args)
{
    if (QThread::isMainThread()) {
        EventType event(args...);
        // Process the event immediately on the Gui thread and return the accepted state
        if (QWindowSystemInterfacePrivate::eventHandler) {
            if (!QWindowSystemInterfacePrivate::eventHandler->sendEvent(&event))
                return false;
        } else {
            QGuiApplicationPrivate::processWindowSystemEvent(&event);
        }
        return event.eventAccepted;
    } else {
        // Post the event on the Qt main thread queue and flush the queue.
        // This will wake up the Gui thread which will process the event.
        // Return the accepted state for the last event on the queue,
        // which is the event posted by this function.
        QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::handleEvent<EventType>(args...);
        return QWindowSystemInterface::flushWindowSystemEvents();
    }
}